

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphIO.cpp
# Opt level: O2

void __thiscall CGraphIO::~CGraphIO(CGraphIO *this)

{
  pointer piVar1;
  pointer pdVar2;
  
  this->_vptr_CGraphIO = (_func_int **)&PTR__CGraphIO_0013cd80;
  piVar1 = (this->m_vi_Vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_vi_Vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->m_vi_Vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  piVar1 = (this->m_vi_OrderedVertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_vi_OrderedVertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->m_vi_OrderedVertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  piVar1 = (this->m_vi_Edges).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_vi_Edges).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->m_vi_Edges).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = piVar1;
  }
  pdVar2 = (this->m_vd_Values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_vd_Values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    (this->m_vd_Values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar2;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->m_vd_Values).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->m_vi_Edges).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->m_vi_OrderedVertices).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->m_vi_Vertices).super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

CGraphIO::~CGraphIO()
{
	m_vi_Vertices.clear();
	m_vi_OrderedVertices.clear();
	m_vi_Edges.clear();
	m_vd_Values.clear();
}